

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O1

MPP_RET mpp_buffer_ref_inc(MppBufferImpl *buffer,char *caller)

{
  list_head *plVar1;
  list_head *plVar2;
  list_head *plVar3;
  hlist_node ***ppphVar4;
  undefined8 in_RAX;
  pthread_mutex_t *__mutex;
  MppBufferService *pMVar5;
  hlist_node *phVar6;
  MPP_RET MVar7;
  undefined4 uVar8;
  
  uVar8 = (undefined4)((ulong)in_RAX >> 0x20);
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_ref_inc");
  }
  pthread_mutex_lock((pthread_mutex_t *)&buffer->lock);
  buffer->ref_count = buffer->ref_count + 1;
  buf_add_log(buffer,BUF_REF_INC,caller);
  MVar7 = MPP_OK;
  if (buffer->used == 0) {
    __mutex = (pthread_mutex_t *)MppBufferService::get_lock();
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(__mutex);
    }
    pMVar5 = MppBufferService::get_instance();
    for (phVar6 = pMVar5->mHashGroup[buffer->group_id * 0x61c88647 >> 0x18].first;
        ppphVar4 = &phVar6[-0xd].pprev, phVar6 != (hlist_node *)0x0; phVar6 = phVar6->next) {
      if (*(RK_U32 *)((long)&phVar6[-9].pprev + 4) == buffer->group_id) goto LAB_00131092;
    }
    ppphVar4 = (hlist_node ***)0x0;
LAB_00131092:
    if (__mutex != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(__mutex);
    }
    if (ppphVar4 == (hlist_node ***)0x0) {
      _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,"group",
                 "inc_buffer_ref",CONCAT44(uVar8,0x164));
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
      buffer->used = 1;
      _mpp_log_l(2,"mpp_buffer","unused buffer without group\n","inc_buffer_ref");
      MVar7 = MPP_NOK;
    }
    else {
      buffer->used = 1;
      pthread_mutex_lock((pthread_mutex_t *)(ppphVar4 + 0x14));
      plVar1 = &buffer->list_status;
      plVar2 = (buffer->list_status).next;
      plVar3 = (buffer->list_status).prev;
      plVar2->prev = plVar3;
      plVar3->next = plVar2;
      (buffer->list_status).next = plVar1;
      (buffer->list_status).prev = plVar1;
      plVar2 = (list_head *)ppphVar4[0x1c];
      ppphVar4[0x1c] = (hlist_node **)plVar1;
      (buffer->list_status).next = (list_head *)(ppphVar4 + 0x1b);
      (buffer->list_status).prev = plVar2;
      plVar2->next = plVar1;
      *(int *)(ppphVar4 + 0x1f) = *(int *)(ppphVar4 + 0x1f) + 1;
      *(int *)((long)ppphVar4 + 0xfc) = *(int *)((long)ppphVar4 + 0xfc) + -1;
      pthread_mutex_unlock((pthread_mutex_t *)(ppphVar4 + 0x14));
      MVar7 = MPP_OK;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&buffer->lock);
  if (((byte)mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_ref_inc");
  }
  return MVar7;
}

Assistant:

MPP_RET mpp_buffer_ref_inc(MppBufferImpl *buffer, const char* caller)
{
    MPP_BUF_FUNCTION_ENTER();

    MPP_RET ret = inc_buffer_ref(buffer, caller);

    MPP_BUF_FUNCTION_LEAVE();
    return ret;
}